

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<long_double>::Print(TPZDohrSubstruct<long_double> *this,ostream *out)

{
  ostream *poVar1;
  void *this_00;
  TPZMatrix<long_double> *pTVar2;
  ostream *in_RSI;
  TPZAutoPointer<TPZMatrix<long_double>_> *this_01;
  TPZMatrixSolver<long_double> *this_02;
  long in_RDI;
  MatrixOutputFormat in_stack_0000039c;
  ostream *in_stack_000003a0;
  char *in_stack_000003a8;
  TPZMatrix<long_double> *in_stack_000003b0;
  TPZVec<std::pair<int,_int>_> *in_stack_ffffffffffffffd8;
  ostream *in_stack_ffffffffffffffe0;
  TPZAutoPointer<TPZMatrix<long_double>_> in_stack_ffffffffffffffe8;
  
  poVar1 = std::operator<<(in_RSI,"++++++++++++++++++++++++++++++++++++");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"Coarse Index ");
  this_01 = (TPZAutoPointer<TPZMatrix<long_double>_> *)(in_RDI + 0x490);
  poVar1 = ::operator<<(in_stack_ffffffffffffffe0,(TPZVec<int> *)in_stack_ffffffffffffffd8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"Global Index ");
  poVar1 = ::operator<<(in_stack_ffffffffffffffe0,(TPZVec<int> *)in_stack_ffffffffffffffd8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"Internal Nodes ");
  poVar1 = ::operator<<(in_stack_ffffffffffffffe0,(TPZVec<int> *)in_stack_ffffffffffffffd8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"Coarse Nodes ");
  this_02 = (TPZMatrixSolver<long_double> *)(in_RDI + 0x2c0);
  poVar1 = ::operator<<(in_stack_ffffffffffffffe0,(TPZVec<int> *)in_stack_ffffffffffffffd8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  TPZMatrix<long_double>::Print
            (in_stack_000003b0,in_stack_000003a8,in_stack_000003a0,in_stack_0000039c);
  TPZMatrix<long_double>::Print
            (in_stack_000003b0,in_stack_000003a8,in_stack_000003a0,in_stack_0000039c);
  TPZMatrix<long_double>::Print
            (in_stack_000003b0,in_stack_000003a8,in_stack_000003a0,in_stack_0000039c);
  poVar1 = std::operator<<(in_RSI,"fNEquations = ");
  this_00 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x2b8));
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"fCoarseNodes ");
  poVar1 = ::operator<<(in_stack_ffffffffffffffe0,(TPZVec<int> *)in_stack_ffffffffffffffd8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"fCoarseIndex ");
  poVar1 = ::operator<<(in_stack_ffffffffffffffe0,(TPZVec<int> *)in_stack_ffffffffffffffd8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"fGlobalEqs ");
  poVar1 = ::operator<<(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"fInternalEqs ");
  poVar1 = ::operator<<(in_stack_ffffffffffffffe0,(TPZVec<int> *)in_stack_ffffffffffffffd8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"fBoundaryEqs ");
  poVar1 = ::operator<<(in_stack_ffffffffffffffe0,(TPZVec<int> *)in_stack_ffffffffffffffd8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  TPZMatrix<long_double>::Print
            (in_stack_000003b0,in_stack_000003a8,in_stack_000003a0,in_stack_0000039c);
  TPZMatrix<long_double>::Print
            (in_stack_000003b0,in_stack_000003a8,in_stack_000003a0,in_stack_0000039c);
  TPZMatrix<long_double>::Print
            (in_stack_000003b0,in_stack_000003a8,in_stack_000003a0,in_stack_0000039c);
  TPZMatrix<long_double>::Print
            (in_stack_000003b0,in_stack_000003a8,in_stack_000003a0,in_stack_0000039c);
  TPZMatrix<long_double>::Print
            (in_stack_000003b0,in_stack_000003a8,in_stack_000003a0,in_stack_0000039c);
  pTVar2 = TPZAutoPointer<TPZMatrix<long_double>_>::operator->
                     ((TPZAutoPointer<TPZMatrix<long_double>_> *)(in_RDI + 0x570));
  (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1c])
            (pTVar2,"Stiffness Matrix",in_RSI,2);
  TPZMatrixSolver<long_double>::Matrix(this_02);
  pTVar2 = TPZAutoPointer<TPZMatrix<long_double>_>::operator->
                     ((TPZAutoPointer<TPZMatrix<long_double>_> *)&stack0xffffffffffffffe8);
  (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1c])
            (pTVar2,"Matrix Ke",in_RSI,2);
  TPZAutoPointer<TPZMatrix<long_double>_>::~TPZAutoPointer(this_01);
  TPZMatrix<long_double>::Print
            (in_stack_000003b0,in_stack_000003a8,in_stack_000003a0,in_stack_0000039c);
  TPZMatrix<long_double>::Print
            (in_stack_000003b0,in_stack_000003a8,in_stack_000003a0,in_stack_0000039c);
  std::operator<<(in_RSI,"fWeights = ");
  poVar1 = ::operator<<(in_RSI,(TPZVec<long_double> *)in_stack_ffffffffffffffe8.fRef);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  TPZMatrix<long_double>::Print
            (in_stack_000003b0,in_stack_000003a8,in_stack_000003a0,in_stack_0000039c);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Print(std::ostream &out) const
{
	out << "++++++++++++++++++++++++++++++++++++" << std::endl;
	out << "Coarse Index " << fCoarseIndex << std::endl;
	out << "Global Index " << fGlobalIndex << std::endl;
	out << "Internal Nodes " << fInternalEqs << std::endl;
	out << "Coarse Nodes " << fCoarseNodes << std::endl;
	//fEigenVectors.Print("Eigen vectors",out);
	fC_star.Print("fC_star",out);
	fKeC_star.Print("fKeC_star", out);
	fNullPivots.Print("fNullPivots", out);
	out << "fNEquations = " << fNEquations << std::endl;
	out << "fCoarseNodes " << fCoarseNodes << std::endl;
	
	out << "fCoarseIndex " << fCoarseIndex << std::endl;
	
	out << "fGlobalEqs " << fGlobalEqs << std::endl;
	out << "fInternalEqs " << fInternalEqs << std::endl;
	out << "fBoundaryEqs " << fBoundaryEqs << std::endl;
	fLocalLoad.Print("fLocalLoad",out);
	fLocalWeightedResidual.Print("fLocalWeightedResidual",out);
	fzi.Print("fzi", out);
	fAdjustSolution.Print("fAdjustSolution", out);
	
	
	fKCi.Print("Coarse Matrix",out);
	fStiffness->Print("Stiffness Matrix",out,EMathematicaInput);
	fInvertedStiffness.Matrix()->Print("Matrix Ke",out,EMathematicaInput);
	fC.Print("Matrix Ci data structure fC",out,EMathematicaInput);
	//fEigenVectors.Print("Eigenvectors",out,EMathematicaInput);
	fPhiC.Print("fPhiC = ",out,EMathematicaInput);
	out << "fWeights = " << fWeights  << endl;
	fPhiC_Weighted_Condensed.Print("fPhiC_Weighted_Condensed = ", out);
}